

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

vm_prop_id_t __thiscall CVmImageLoader::alloc_new_prop(CVmImageLoader *this)

{
  vm_val_t new_cont;
  vm_val_t val;
  vm_val_t idx_val;
  CVmObjVector *vec;
  vm_val_t *in_stack_ffffffffffffffb8;
  vm_obj_id_t in_stack_ffffffffffffffc4;
  vm_val_t *in_stack_ffffffffffffffc8;
  CVmObject *in_stack_ffffffffffffffd0;
  short local_28;
  vm_val_t local_20;
  CVmObject *local_10;
  
  local_10 = vm_objp(0);
  vm_val_t::set_int(&local_20,1);
  CVmObject::index_val
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffb8);
  if (local_28 == -1) {
    err_throw(0);
  }
  CVmObject::set_index_val
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffb8,(vm_val_t *)0x361d71);
  return local_28 + 1;
}

Assistant:

vm_prop_id_t CVmImageLoader::alloc_new_prop(VMG0_)
{
    CVmObjVector *vec;
    vm_val_t idx_val;
    vm_val_t val;
    vm_val_t new_cont;

    /* get the LastPropObj vector */
    vec = (CVmObjVector *)vm_objp(vmg_ G_predef->last_prop_obj);

    /* 
     *   get the element at index 1 - our last property value is always at
     *   the first element 
     */
    idx_val.set_int(1);

    /* get the value from the vector */
    vec->index_val(vmg_ &val, G_predef->last_prop_obj, &idx_val);

    /* if we've allocated every available property ID, throw an error */
    if (val.val.prop == 65535)
        err_throw(VMERR_OUT_OF_PROPIDS);

    /* allocate the new property ID by incrementing the last used ID */
    ++val.val.prop;

    /* 
     *   update the vector with the new value (this new property ID is now
     *   the last property ID in use) 
     */
    vec->set_index_val(vmg_ &new_cont, G_predef->last_prop_obj,
                       &idx_val, &val);

    /* return the new last ID */
    return val.val.prop;
}